

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  _Head_base<0UL,_Rml::FontFamily_*,_false> _Var3;
  Node *pNVar4;
  pointer __p;
  long lVar5;
  size_type sVar6;
  uint8_t *puVar7;
  InfoType IVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  
  pNVar2 = this->mKeyVals;
  pNVar4 = pNVar2 + startIdx;
  paVar1 = &pNVar2[startIdx].mData.first.field_2;
  (&paVar1->_M_allocated_capacity)[-2] = (size_type)paVar1;
  paVar9 = &pNVar2[startIdx - 1].mData.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar1->_M_allocated_capacity)[-7] == paVar9) {
    sVar6 = *(size_type *)((long)&pNVar2[startIdx - 1].mData.first.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    (&paVar1->_M_allocated_capacity)[1] = sVar6;
  }
  else {
    (pNVar4->mData).first._M_dataplus._M_p = (pointer)(&paVar1->_M_allocated_capacity)[-7];
    (pNVar4->mData).first.field_2._M_allocated_capacity =
         pNVar4[-1].mData.first.field_2._M_allocated_capacity;
  }
  _Var3._M_head_impl =
       pNVar4[-1].mData.second._M_t.
       super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>._M_t.
       super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
       super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl;
  (pNVar4->mData).first._M_string_length = pNVar4[-1].mData.first._M_string_length;
  pNVar4[-1].mData.first._M_dataplus._M_p = (pointer)paVar9;
  pNVar4[-1].mData.first._M_string_length = 0;
  pNVar4[-1].mData.first.field_2._M_local_buf[0] = '\0';
  (pNVar4->mData).second._M_t.
  super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>._M_t.
  super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
  super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl = _Var3._M_head_impl;
  pNVar4[-1].mData.second._M_t.
  super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>._M_t.
  super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
  super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl = (FontFamily *)0x0;
  if (startIdx - 1 != insertion_idx) {
    lVar10 = (insertion_idx - startIdx) + 1;
    lVar5 = startIdx * 0x28;
    do {
      pNVar4 = this->mKeyVals;
      std::__cxx11::string::operator=
                ((string *)((long)&pNVar4[-1].mData.first._M_dataplus._M_p + lVar5),
                 (string *)((long)&pNVar4[-2].mData.first._M_dataplus._M_p + lVar5));
      __p = *(pointer *)
             ((long)&pNVar4[-2].mData.second._M_t.
                     super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>
             + lVar5);
      *(undefined8 *)
       ((long)&pNVar4[-2].mData.second._M_t.
               super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>._M_t.
               super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_> +
       lVar5) = 0;
      std::__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::reset
                ((__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                 ((long)&pNVar4[-1].mData.second._M_t.
                         super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>
                 + lVar5),__p);
      lVar10 = lVar10 + 1;
      lVar5 = lVar5 + -0x28;
    } while (lVar10 != 0);
  }
  if (startIdx != insertion_idx) {
    puVar7 = this->mInfo;
    IVar8 = this->mInfoInc;
    do {
      puVar7[startIdx] = (char)IVar8 + puVar7[startIdx - 1];
      puVar7 = this->mInfo;
      IVar8 = this->mInfoInc;
      if (0xff < puVar7[startIdx] + IVar8) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }